

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::debugging_internal::ParseTemplateArg(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ParseState copy;
  
  iVar6 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar6 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar6) {
    bVar3 = false;
    goto LAB_00174081;
  }
  copy.mangled_idx = (state->parse_state).mangled_idx;
  copy.out_cur_idx = (state->parse_state).out_cur_idx;
  copy.prev_name_idx = (state->parse_state).prev_name_idx;
  copy._12_4_ = *(undefined4 *)&(state->parse_state).field_0xc;
  bVar3 = ParseOneCharToken(state,'J');
  if (bVar3) {
    do {
      bVar3 = ParseTemplateArg(state);
    } while (bVar3);
    bVar4 = ParseOneCharToken(state,'E');
    bVar3 = true;
    if (!bVar4) goto LAB_0017401b;
  }
  else {
LAB_0017401b:
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = copy.mangled_idx;
    pPVar1->out_cur_idx = copy.out_cur_idx;
    (state->parse_state).prev_name_idx = copy.prev_name_idx;
    *(undefined4 *)&(state->parse_state).field_0xc = copy._12_4_;
    bVar4 = ParseLocalSourceName(state);
    if (bVar4) {
      ParseTemplateArgs(state);
      copy.mangled_idx = pPVar1->mangled_idx;
      copy.out_cur_idx = pPVar1->out_cur_idx;
      copy.prev_name_idx = (state->parse_state).prev_name_idx;
      copy._12_4_ = *(undefined4 *)&(state->parse_state).field_0xc;
      bVar5 = ParseExprCastValueAndTrailingE(state);
LAB_00174050:
      bVar3 = true;
      if (bVar5 == false) {
LAB_00174054:
        pPVar1->mangled_idx = copy.mangled_idx;
        pPVar1->out_cur_idx = copy.out_cur_idx;
        (state->parse_state).prev_name_idx = copy.prev_name_idx;
        *(undefined4 *)&(state->parse_state).field_0xc = copy._12_4_;
        bVar3 = bVar4;
      }
    }
    else {
      bVar5 = ParseType(state);
      bVar3 = true;
      if (!bVar5) {
        bVar5 = ParseExprPrimary(state);
        if (!bVar5) {
          pPVar1->mangled_idx = copy.mangled_idx;
          pPVar1->out_cur_idx = copy.out_cur_idx;
          (state->parse_state).prev_name_idx = copy.prev_name_idx;
          *(undefined4 *)&(state->parse_state).field_0xc = copy._12_4_;
          bVar5 = ParseOneCharToken(state,'X');
          if (bVar5) {
            bVar5 = ParseExpression(state);
            if (bVar5) {
              bVar5 = ParseOneCharToken(state,'E');
              if (bVar5) goto LAB_0017407c;
            }
          }
          pPVar1->mangled_idx = copy.mangled_idx;
          pPVar1->out_cur_idx = copy.out_cur_idx;
          (state->parse_state).prev_name_idx = copy.prev_name_idx;
          *(undefined4 *)&(state->parse_state).field_0xc = copy._12_4_;
          bVar3 = ParseTemplateParamDecl(state);
          if (bVar3) {
            bVar5 = ParseTemplateArg(state);
            goto LAB_00174050;
          }
          goto LAB_00174054;
        }
      }
    }
  }
LAB_0017407c:
  iVar6 = state->recursion_depth + -1;
LAB_00174081:
  state->recursion_depth = iVar6;
  return bVar3;
}

Assistant:

static bool ParseTemplateArg(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'J') && ZeroOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // There can be significant overlap between the following leading to
  // exponential backtracking:
  //
  //   <expr-primary> ::= L <type> <expr-cast-value> E
  //                 e.g. L 2xxIvE 1                 E
  //   <type>         ==> <local-source-name> <template-args>
  //                 e.g. L 2xx               IvE
  //
  // This means parsing an entire <type> twice, and <type> can contain
  // <template-arg>, so this can generate exponential backtracking.  There is
  // only overlap when the remaining input starts with "L <source-name>", so
  // parse all cases that can start this way jointly to share the common prefix.
  //
  // We have:
  //
  //   <template-arg> ::= <type>
  //                  ::= <expr-primary>
  //
  // First, drop all the productions of <type> that must start with something
  // other than 'L'.  All that's left is <class-enum-type>; inline it.
  //
  //   <type> ::= <nested-name> # starts with 'N'
  //          ::= <unscoped-name>
  //          ::= <unscoped-template-name> <template-args>
  //          ::= <local-name> # starts with 'Z'
  //
  // Drop and inline again:
  //
  //   <type> ::= <unscoped-name>
  //          ::= <unscoped-name> <template-args>
  //          ::= <substitution> <template-args> # starts with 'S'
  //
  // Merge the first two, inline <unscoped-name>, drop last:
  //
  //   <type> ::= <unqualified-name> [<template-args>]
  //          ::= St <unqualified-name> [<template-args>] # starts with 'S'
  //
  // Drop and inline:
  //
  //   <type> ::= <operator-name> [<template-args>] # starts with lowercase
  //          ::= <ctor-dtor-name> [<template-args>] # starts with 'C' or 'D'
  //          ::= <source-name> [<template-args>] # starts with digit
  //          ::= <local-source-name> [<template-args>]
  //          ::= <unnamed-type-name> [<template-args>] # starts with 'U'
  //
  // One more time:
  //
  //   <type> ::= L <source-name> [<template-args>]
  //
  // Likewise with <expr-primary>:
  //
  //   <expr-primary> ::= L <type> <expr-cast-value> E
  //                  ::= LZ <encoding> E # cannot overlap; drop
  //                  ::= L <mangled_name> E # cannot overlap; drop
  //
  // By similar reasoning as shown above, the only <type>s starting with
  // <source-name> are "<source-name> [<template-args>]".  Inline this.
  //
  //   <expr-primary> ::= L <source-name> [<template-args>] <expr-cast-value> E
  //
  // Now inline both of these into <template-arg>:
  //
  //   <template-arg> ::= L <source-name> [<template-args>]
  //                  ::= L <source-name> [<template-args>] <expr-cast-value> E
  //
  // Merge them and we're done:
  //   <template-arg>
  //     ::= L <source-name> [<template-args>] [<expr-cast-value> E]
  if (ParseLocalSourceName(state) && Optional(ParseTemplateArgs(state))) {
    copy = state->parse_state;
    if (ParseExprCastValueAndTrailingE(state)) {
      return true;
    }
    state->parse_state = copy;
    return true;
  }

  // Now that the overlapping cases can't reach this code, we can safely call
  // both of these.
  if (ParseType(state) || ParseExprPrimary(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'X') && ParseExpression(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTemplateParamDecl(state) && ParseTemplateArg(state)) {
    return true;
  }
  state->parse_state = copy;

  return false;
}